

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arenas_narenas_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                      size_t newlen)

{
  ulong uVar1;
  undefined8 in_RAX;
  int iVar2;
  size_t __n;
  undefined4 uStack_28;
  uint narenas;
  
  _uStack_28 = in_RAX;
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  if (newp == (void *)0x0 && newlen == 0) {
    _uStack_28 = CONCAT44(ctl_arenas->narenas,uStack_28);
    iVar2 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 4) {
        *(uint *)oldp = ctl_arenas->narenas;
        iVar2 = 0;
      }
      else {
        __n = 4;
        if (uVar1 < 4) {
          __n = uVar1;
        }
        switchD_016b0717::default(oldp,&narenas,__n);
        *oldlenp = __n;
        iVar2 = 0x16;
      }
    }
  }
  else {
    iVar2 = 1;
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x48));
  return iVar2;
}

Assistant:

static int
arenas_narenas_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned narenas;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	READONLY();
	narenas = ctl_arenas->narenas;
	READ(narenas, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}